

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O3

int Dar_CutMergeOrdered(Dar_Cut_t *pC,Dar_Cut_t *pC0,Dar_Cut_t *pC1)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  
  uVar5 = *(uint *)&pC0->field_0x4;
  uVar2 = *(uint *)&pC1->field_0x4 >> 0x1d;
  if (uVar5 >> 0x1d < uVar2) {
    __assert_fail("pC0->nLeaves >= pC1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                  ,0x10e,"int Dar_CutMergeOrdered(Dar_Cut_t *, Dar_Cut_t *, Dar_Cut_t *)");
  }
  if ((uVar5 >> 0x1d == 4) && (uVar2 == 4)) {
    if (pC0->uSign != pC1->uSign) {
      return 0;
    }
    lVar6 = 0;
    do {
      if (pC0->pLeaves[lVar6] != pC1->pLeaves[lVar6]) {
        return 0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if (0x1fffffff < uVar5) {
      uVar3 = 0;
      do {
        pC->pLeaves[uVar3] = pC0->pLeaves[uVar3];
        uVar3 = uVar3 + 1;
        uVar5 = *(uint *)&pC0->field_0x4;
      } while (uVar3 < uVar5 >> 0x1d);
    }
    uVar5 = uVar5 & 0xe0000000;
  }
  else {
    piVar4 = pC->pLeaves;
    lVar6 = 0;
    uVar2 = 0;
    uVar5 = 0;
    do {
      uVar7 = *(uint *)&pC0->field_0x4 >> 0x1d;
      if (uVar2 == *(uint *)&pC1->field_0x4 >> 0x1d) {
        if (uVar5 == uVar7) {
          uVar5 = -(int)lVar6;
          goto LAB_004f4d08;
        }
        lVar9 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        iVar8 = pC0->pLeaves[lVar9];
LAB_004f4cb9:
        *piVar4 = iVar8;
      }
      else {
        if (uVar5 == uVar7) {
          iVar8 = pC1->pLeaves[(int)uVar2];
          uVar2 = uVar2 + 1;
          goto LAB_004f4cb9;
        }
        iVar8 = pC0->pLeaves[(int)uVar5];
        iVar1 = pC1->pLeaves[(int)uVar2];
        if (iVar8 < iVar1) {
          uVar5 = uVar5 + 1;
          goto LAB_004f4cb9;
        }
        if (iVar1 < iVar8) {
          uVar2 = uVar2 + 1;
          *piVar4 = iVar1;
        }
        else {
          uVar5 = uVar5 + 1;
          *piVar4 = iVar8;
          uVar2 = uVar2 + 1;
        }
      }
      lVar6 = lVar6 + -0x20000000;
      piVar4 = piVar4 + 1;
    } while (lVar6 != -0x80000000);
    if ((int)uVar5 < (int)(*(uint *)&pC0->field_0x4 >> 0x1d)) {
      return 0;
    }
    uVar5 = 0x80000000;
    if ((int)uVar2 < (int)(*(uint *)&pC1->field_0x4 >> 0x1d)) {
      return 0;
    }
  }
LAB_004f4d08:
  *(uint *)&pC->field_0x4 = *(uint *)&pC->field_0x4 & 0x1fffffff | uVar5;
  return 1;
}

Assistant:

static inline int Dar_CutMergeOrdered( Dar_Cut_t * pC, Dar_Cut_t * pC0, Dar_Cut_t * pC1 )
{ 
    int i, k, c;
    assert( pC0->nLeaves >= pC1->nLeaves );

    // the case of the largest cut sizes
    if ( pC0->nLeaves == 4 && pC1->nLeaves == 4 )
    {
        if ( pC0->uSign != pC1->uSign )
            return 0;
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            pC->pLeaves[i] = pC0->pLeaves[i];
        pC->nLeaves = pC0->nLeaves;
        return 1;
    }

    // the case when one of the cuts is the largest
    if ( pC0->nLeaves == 4 )
    {
        if ( (pC0->uSign & pC1->uSign) != pC1->uSign )
            return 0;
        for ( i = 0; i < (int)pC1->nLeaves; i++ )
        {
            for ( k = (int)pC0->nLeaves - 1; k >= 0; k-- )
                if ( pC0->pLeaves[k] == pC1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < (int)pC0->nLeaves; i++ )
            pC->pLeaves[i] = pC0->pLeaves[i];
        pC->nLeaves = pC0->nLeaves;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < 4; c++ )
    {
        if ( k == (int)pC1->nLeaves )
        {
            if ( i == (int)pC0->nLeaves )
            {
                pC->nLeaves = c;
                return 1;
            }
            pC->pLeaves[c] = pC0->pLeaves[i++];
            continue;
        }
        if ( i == (int)pC0->nLeaves )
        {
            if ( k == (int)pC1->nLeaves )
            {
                pC->nLeaves = c;
                return 1;
            }
            pC->pLeaves[c] = pC1->pLeaves[k++];
            continue;
        }
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            pC->pLeaves[c] = pC0->pLeaves[i++];
            continue;
        }
        if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            pC->pLeaves[c] = pC1->pLeaves[k++];
            continue;
        }
        pC->pLeaves[c] = pC0->pLeaves[i++]; 
        k++;
    }
    if ( i < (int)pC0->nLeaves || k < (int)pC1->nLeaves )
        return 0;
    pC->nLeaves = c;
    return 1;
}